

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_string.c
# Opt level: O0

char * d_string_free(DString *ripString,_Bool freeCharacterData)

{
  DString *local_28;
  char *returnedString;
  _Bool freeCharacterData_local;
  DString *ripString_local;
  
  if (ripString == (DString *)0x0) {
    ripString_local = (DString *)0x0;
  }
  else {
    local_28 = (DString *)ripString->str;
    if (freeCharacterData) {
      if (ripString->str != (char *)0x0) {
        free(ripString->str);
      }
      local_28 = (DString *)0x0;
    }
    free(ripString);
    ripString_local = local_28;
  }
  return (char *)ripString_local;
}

Assistant:

char * d_string_free(DString * ripString, bool freeCharacterData) {
	if (ripString == NULL) {
		return NULL;
	}

	char * returnedString = ripString->str;

	if (freeCharacterData) {
		if (ripString->str != NULL) {
			free(ripString->str);
		}

		returnedString = NULL;
	}

	free(ripString);

	return returnedString;
}